

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  uint *puVar1;
  ushort *puVar2;
  int32_t *piVar3;
  int64_t *piVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int64_t iVar13;
  undefined8 uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint64_t uVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  uint16_t *m_00;
  char cVar22;
  uint16_t *puVar23;
  long lVar24;
  uint16_t *puVar25;
  ulong unaff_RBP;
  secp256k1_modinv32_modinfo *modinfo;
  ulong uVar26;
  secp256k1_modinv64_modinfo *psVar27;
  uint uVar28;
  secp256k1_modinv64_modinfo *a;
  secp256k1_modinv64_signed62 *psVar29;
  secp256k1_modinv64_signed62 *psVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int32_t iVar34;
  secp256k1_modinv64_modinfo *out_00;
  uint uVar35;
  int iVar36;
  code *pcVar37;
  code *pcVar38;
  int iVar39;
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  int iStack_27c;
  secp256k1_modinv32_trans2x2 sStack_278;
  undefined8 uStack_268;
  secp256k1_modinv32_signed30 sStack_260;
  int iStack_234;
  secp256k1_modinv32_signed30 sStack_230;
  uint16_t *puStack_208;
  ulong uStack_200;
  code *pcStack_1f8;
  secp256k1_modinv32_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_signed62 sStack_1d0;
  secp256k1_modinv64_modinfo sStack_1a0;
  ushort auStack_170 [16];
  code *pcStack_150;
  uint16_t *puStack_148;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  undefined8 uStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv32_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar27 = &local_e8;
  a = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar15 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar15 & 0xff) / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((in[uVar15 >> 4] >> (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  uVar35 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  pcVar37 = (code *)(ulong)uVar35;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  local_b8.modulus.v[5] = 0;
  local_b8.modulus.v[6] = 0;
  local_b8.modulus.v[7] = 0;
  local_b8.modulus.v[8] = 0;
  uVar15 = 0;
  do {
    modinfo = (secp256k1_modinv32_modinfo *)(ulong)mod[uVar15 >> 4];
    piVar3 = local_b8.modulus.v + (uVar15 & 0xff) / 0x1e;
    *piVar3 = *piVar3 | (uint)((mod[uVar15 >> 4] >> (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  iVar34 = local_b8.modulus.v[0];
  out_00 = (secp256k1_modinv64_modinfo *)(long)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x15ff33;
  uVar18 = modinv2p64((uint64_t)out_00);
  local_b8.modulus_inv30 = (uint)uVar18 & 0x3fffffff;
  uVar15 = iVar34 * (uint)uVar18 & 0x3fffffff;
  uVar31 = (ulong)uVar15;
  puVar23 = mod;
  if (uVar15 != 1) goto LAB_0016030f;
  if (uVar35 == 0) {
LAB_00160095:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar15 = 0;
    do {
      puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar15 & 0xff) / 0x1e) * 4);
      *puVar1 = *puVar1 | (uint)((in[uVar15 >> 4] >> (uVar15 & 0xf) & 1) != 0) <<
                          ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x100);
    iVar16 = 0x10;
    do {
      uVar31 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3d;
      iVar36 = local_b8.modulus.v[uVar31];
      if (iVar36 < 1) {
        if ((iVar36 < 0) && (iVar21 = local_b8.modulus.v[uVar31 + 1], 0x3ffffffe < iVar21)) {
          local_b8.modulus.v[uVar31] = iVar36 + 0x40000000;
          iVar34 = iVar21 + -1;
          goto LAB_0016014b;
        }
      }
      else {
        iVar21 = local_b8.modulus.v[uVar31 + 1];
        if (iVar21 < 0x40000000) {
          local_b8.modulus.v[uVar31] = iVar36 + -0x40000000;
          iVar34 = iVar21 + 1;
LAB_0016014b:
          local_b8.modulus.v[uVar31 + 1] = iVar34;
        }
      }
      uVar32 = secp256k1_test_state[1] << 0x11;
      uVar26 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar31 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar26;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar31;
      secp256k1_test_state[2] = uVar26 ^ uVar32;
      secp256k1_test_state[3] = uVar31 << 0x2d | uVar31 >> 0x13;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    unaff_RBP = (ulong)(uVar35 != 0);
    puVar23 = (uint16_t *)CONCAT71((int7)((ulong)mod >> 8),1);
    uVar31 = 0x88888889;
    local_88.modulus_inv62 = (uint64_t)mod;
    while( true ) {
      cVar22 = (char)puVar23;
      pcVar37 = secp256k1_modinv32_var;
      if (cVar22 != '\0') {
        pcVar37 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x1601e6;
      (*pcVar37)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar15 = 0;
      do {
        out[uVar15 >> 4] =
             out[uVar15 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + (ulong)((uVar15 & 0xff) / 0x1e) * 4) >>
                       uVar15 % 0x1e & 1) != 0) << ((byte)uVar15 & 0xf);
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x100);
      out_00 = &local_88;
      pcStack_f0 = (code *)0x16024b;
      modinfo = (secp256k1_modinv32_modinfo *)out;
      mulmod256((uint16_t *)out_00,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar35 != 0)) break;
      lVar19 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar19 * 2) != 0) {
          pcStack_f0 = (code *)0x160305;
          test_modinv32_uint16_cold_4();
          goto LAB_00160305;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pcStack_f0 = (code *)0x16027b;
      (*pcVar37)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar15 = 0;
      do {
        uVar28 = *(uint *)((long)local_e8.modulus.v + (ulong)((uVar15 & 0xff) / 0x1e) * 4);
        modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar28;
        uVar28 = (uint)((uVar28 >> uVar15 % 0x1e & 1) != 0) << ((byte)uVar15 & 0xf);
        out_00 = (secp256k1_modinv64_modinfo *)(ulong)uVar28;
        puVar2 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar15 >> 4) * 2);
        *puVar2 = *puVar2 | (ushort)uVar28;
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x100);
      lVar19 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar19 * 2) != in[lVar19]) goto LAB_00160305;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      puVar23 = (uint16_t *)0x0;
      if (cVar22 == '\0') {
        return;
      }
    }
    goto LAB_0016030a;
  }
  pcStack_f0 = (code *)0x15ff6b;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar15 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar15 & 0xff) / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar15 >> 4) * 2) >>
                                (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x15ffd7;
  uVar15 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if (1 < uVar15) goto LAB_00160314;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x160010;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar15 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar15 & 0xff) / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar15 >> 4) * 2) >>
                                (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16007c;
  iVar16 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if ((iVar16 == 0) || (iVar16 == 1 - (*mod & 2))) goto LAB_00160095;
LAB_00160319:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = pcVar37;
  uStack_110 = uVar31;
  puStack_118 = puVar23;
  psVar29 = &sStack_1d0;
  psVar30 = &sStack_1d0;
  sStack_1d0.v[0] = 0;
  sStack_1d0.v[1] = 0;
  sStack_1d0.v[2] = 0;
  sStack_1d0.v[3] = 0;
  sStack_1d0.v[4] = 0;
  uVar31 = 0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar31 >> 1;
    sStack_1d0.v[((byte)((uVar31 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
         sStack_1d0.v[((byte)((uVar31 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
         (ulong)((*(ushort *)((long)(modinfo->modulus).v + (uVar31 >> 4 & 0xfffffff) * 2) >>
                  ((uint)uVar31 & 0xf) & 1) != 0) <<
         ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar31 &
         0x3fU);
    uVar31 = uVar31 + 1;
  } while ((int)uVar31 != 0x100);
  pcStack_150 = (code *)(sStack_1d0.v[1] | sStack_1d0.v[0] | sStack_1d0.v[2] | sStack_1d0.v[3] |
                        sStack_1d0.v[4]);
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar27 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)psVar27 >> 1;
    piVar4 = sStack_1a0.modulus.v + ((byte)(((ulong)psVar27 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar4 = *piVar4 | (ulong)((m_00[(ulong)psVar27 >> 4 & 0xfffffff] >> ((uint)psVar27 & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar27 & 0x3fU);
    iVar13 = sStack_1a0.modulus.v[0];
    psVar27 = (secp256k1_modinv64_modinfo *)((long)(psVar27->modulus).v + 1);
  } while ((int)psVar27 != 0x100);
  pcVar38 = (code *)0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x16044c;
  puVar23 = (uint16_t *)sStack_1a0.modulus.v[0];
  uVar18 = modinv2p64(sStack_1a0.modulus.v[0]);
  pcVar37 = pcStack_150;
  sStack_1a0.modulus_inv62 = uVar18 & 0x3fffffffffffffff;
  uVar31 = iVar13 * uVar18 & 0x3fffffffffffffff;
  puVar25 = m_00;
  if (uVar31 == 1) {
    uVar31 = 0x3fffffffffffffff;
    if (pcStack_150 == (code *)0x0) {
LAB_001605cd:
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar31 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar31 >> 1;
        sStack_1d0.v[((byte)((uVar31 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
             sStack_1d0.v[((byte)((uVar31 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
             (ulong)((*(ushort *)((long)(modinfo->modulus).v + (uVar31 >> 4 & 0xfffffff) * 2) >>
                      ((uint)uVar31 & 0xf) & 1) != 0) <<
             ((char)(SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar31 &
             0x3fU);
        uVar31 = uVar31 + 1;
      } while ((int)uVar31 != 0x100);
      puStack_148 = m_00;
      iVar16 = 8;
      do {
        uVar31 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0] >> 0x3e;
        lVar19 = sStack_1a0.modulus.v[uVar31];
        if (lVar19 < 1) {
          if ((lVar19 < 0) &&
             (lVar24 = sStack_1a0.modulus.v[uVar31 + 1], -0x4000000000000000 < lVar24)) {
            sStack_1a0.modulus.v[uVar31] = lVar19 + 0x4000000000000000;
            lVar24 = lVar24 + -1;
            goto LAB_0016069d;
          }
        }
        else {
          lVar24 = sStack_1a0.modulus.v[uVar31 + 1];
          if (lVar24 < 0x4000000000000000) {
            sStack_1a0.modulus.v[uVar31] = lVar19 + -0x4000000000000000;
            lVar24 = lVar24 + 1;
LAB_0016069d:
            sStack_1a0.modulus.v[uVar31 + 1] = lVar24;
          }
        }
        uVar32 = secp256k1_test_state[1] << 0x11;
        uVar26 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar31 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar26;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar31;
        secp256k1_test_state[2] = uVar26 ^ uVar32;
        secp256k1_test_state[3] = uVar31 << 0x2d | uVar31 >> 0x13;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      puVar25 = (uint16_t *)(ulong)(pcVar37 != (code *)0x0);
      uVar31 = 0x3fffffffffffff01;
      while( true ) {
        cVar22 = (char)uVar31;
        pcVar38 = secp256k1_modinv64_var;
        if (cVar22 != '\0') {
          pcVar38 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x160727;
        (*pcVar38)(&sStack_1d0);
        (a->modulus).v[2] = 0;
        (a->modulus).v[3] = 0;
        (a->modulus).v[0] = 0;
        (a->modulus).v[1] = 0;
        uVar26 = 0;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar26 >> 1;
          puVar2 = (ushort *)((long)(a->modulus).v + (uVar26 >> 4 & 0xfffffff) * 2);
          *puVar2 = *puVar2 | (ushort)(((ulong)sStack_1d0.v
                                               [((byte)((uVar26 & 0xffffffff) >> 1) & 0x7f) / 0x1f]
                                        >> ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar26) & 0x3f) & 1) != 0) <<
                              ((byte)uVar26 & 0xf);
          uVar26 = uVar26 + 1;
        } while ((int)uVar26 != 0x100);
        puVar23 = auStack_170;
        pcStack_1d8 = (code *)0x160798;
        psVar27 = a;
        mulmod256(puVar23,(uint16_t *)a,(uint16_t *)modinfo,puStack_148);
        if (auStack_170[0] != (pcVar37 != (code *)0x0)) break;
        lVar19 = 1;
        do {
          if (auStack_170[lVar19] != 0) {
            pcStack_1d8 = (code *)0x160860;
            test_modinv64_uint16_cold_4();
            goto LAB_00160860;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        pcStack_1d8 = (code *)0x1607c8;
        (*pcVar38)(&sStack_1d0);
        auStack_170[8] = 0;
        auStack_170[9] = 0;
        auStack_170[10] = 0;
        auStack_170[0xb] = 0;
        auStack_170[0xc] = 0;
        auStack_170[0xd] = 0;
        auStack_170[0xe] = 0;
        auStack_170[0xf] = 0;
        auStack_170[0] = 0;
        auStack_170[1] = 0;
        auStack_170[2] = 0;
        auStack_170[3] = 0;
        auStack_170[4] = 0;
        auStack_170[5] = 0;
        auStack_170[6] = 0;
        auStack_170[7] = 0;
        psVar27 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = (ulong)psVar27 >> 1;
          puVar23 = (uint16_t *)
                    ((ulong)(((ulong)sStack_1d0.v
                                     [((byte)(((ulong)psVar27 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                              ((ulong)((SUB164(auVar12 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                      (int)psVar27) & 0x3f) & 1) != 0) << ((byte)psVar27 & 0xf));
          auStack_170[(ulong)psVar27 >> 4 & 0xfffffff] =
               auStack_170[(ulong)psVar27 >> 4 & 0xfffffff] | (ushort)puVar23;
          psVar27 = (secp256k1_modinv64_modinfo *)((long)(psVar27->modulus).v + 1);
        } while ((int)psVar27 != 0x100);
        lVar19 = 0;
        do {
          if (auStack_170[lVar19] != *(ushort *)((long)(modinfo->modulus).v + lVar19 * 2))
          goto LAB_00160860;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        uVar31 = 0;
        if (cVar22 == '\0') {
          return;
        }
      }
LAB_00160865:
      pcStack_1d8 = (code *)0x16086a;
      test_modinv64_uint16_cold_3();
      goto LAB_0016086a;
    }
    pcStack_1d8 = (code *)0x16048f;
    mulmod256(auStack_170,(uint16_t *)modinfo,(uint16_t *)modinfo,m_00);
    sStack_1d0.v[2] = 0;
    sStack_1d0.v[3] = 0;
    sStack_1d0.v[0] = 0;
    sStack_1d0.v[1] = 0;
    sStack_1d0.v[4] = 0;
    uVar26 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar26 >> 1;
      sStack_1d0.v[((byte)((uVar26 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
           sStack_1d0.v[((byte)((uVar26 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
           (ulong)((auStack_170[uVar26 >> 4 & 0xfffffff] >> ((uint)uVar26 & 0xf) & 1) != 0) <<
           ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar26 &
           0x3fU);
      uVar26 = uVar26 + 1;
    } while ((int)uVar26 != 0x100);
    psVar27 = &sStack_1a0;
    pcStack_1d8 = (code *)0x160505;
    uVar15 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar27);
    pcVar38 = pcVar37;
    if (uVar15 < 2) {
      uStack_140 = *m_00 - 1;
      uStack_13e = *(undefined8 *)(m_00 + 1);
      uStack_128 = *(undefined8 *)(m_00 + 0xc);
      uStack_136 = (undefined6)*(undefined8 *)(m_00 + 5);
      uStack_130 = (undefined2)*(undefined8 *)(m_00 + 8);
      uStack_12e = (undefined6)((ulong)*(undefined8 *)(m_00 + 8) >> 0x10);
      pcStack_1d8 = (code *)0x16053e;
      mulmod256(auStack_170,auStack_170,&uStack_140,m_00);
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar26 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar26 >> 1;
        sStack_1d0.v[((byte)((uVar26 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
             sStack_1d0.v[((byte)((uVar26 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
             (ulong)((auStack_170[uVar26 >> 4 & 0xfffffff] >> ((uint)uVar26 & 0xf) & 1) != 0) <<
             ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar26 &
             0x3fU);
        uVar26 = uVar26 + 1;
      } while ((int)uVar26 != 0x100);
      psVar27 = &sStack_1a0;
      pcStack_1d8 = (code *)0x1605b4;
      iVar16 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar27);
      if ((iVar16 != 0) && (iVar16 != 1 - (*m_00 & 2))) goto LAB_00160874;
      goto LAB_001605cd;
    }
  }
  else {
LAB_0016086a:
    pcStack_1d8 = (code *)0x16086f;
    test_modinv64_uint16_cold_1();
    psVar29 = (secp256k1_modinv64_signed62 *)puVar23;
  }
  psVar30 = psVar29;
  pcStack_1d8 = (code *)0x160874;
  test_modinv64_uint16_cold_6();
LAB_00160874:
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar30 & 1) != 0) {
    iVar16 = 6;
    do {
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = a;
  psStack_1f0 = modinfo;
  pcStack_1f8 = pcVar38;
  uStack_200 = uVar31;
  puStack_208 = puVar25;
  sStack_260.v[8] = (int32_t)(psVar27->modulus).v[4];
  iVar13 = (psVar27->modulus).v[0];
  sStack_260.v._16_8_ = (psVar27->modulus).v[2];
  sStack_260.v._24_8_ = (psVar27->modulus).v[3];
  sStack_260.v[0] = (int)iVar13;
  sStack_260.v[1] = (int)((ulong)iVar13 >> 0x20);
  uVar14 = sStack_260.v._0_8_;
  sStack_260.v._8_8_ = (psVar27->modulus).v[1];
  sStack_230.v[8] = *(int32_t *)((long)psVar30 + 0x20);
  sStack_230.v._0_8_ = psVar30->v[0];
  sStack_230.v._8_8_ = *(undefined8 *)((long)psVar30 + 8);
  sStack_230.v._16_8_ = *(undefined8 *)((long)psVar30 + 0x10);
  sStack_230.v._24_8_ = *(undefined8 *)((long)psVar30 + 0x18);
  uVar31 = 9;
  iVar36 = -1;
  iVar16 = 0;
  sStack_260.v[0] = (int32_t)iVar13;
  uVar15 = sStack_260.v[0];
  sStack_260.v._0_8_ = uVar14;
  do {
    iVar21 = 0;
    if ((sStack_230.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_230.v[0] | 0xc0000000U) >> iVar21 & 1) == 0; iVar21 = iVar21 + 1) {
      }
    }
    iVar36 = iVar36 - iVar21;
    if (iVar21 == 0x1e) {
      sStack_278.u = 0x40000000;
      iStack_27c = 1;
      sStack_278.q = 0;
      sStack_278.v = 0;
    }
    else {
      uVar15 = sStack_260.v[1] << 0x1e | uVar15;
      iStack_27c = 1;
      sStack_278.u = 1 << ((byte)iVar21 & 0x1f);
      uVar35 = (uint)(sStack_230.v[1] << 0x1e | sStack_230.v[0]) >> ((byte)iVar21 & 0x1f);
      iVar21 = 0x1e - iVar21;
      sStack_278.v = 0;
      sStack_278.q = 0;
      do {
        uVar28 = uVar35;
        iVar39 = sStack_278.u;
        iVar33 = sStack_278.v;
        if (iVar36 < 0) {
          iVar36 = -iVar36;
          uVar28 = uVar15;
          iVar39 = sStack_278.q;
          uVar15 = uVar35;
          sStack_278.q = sStack_278.u;
          iVar33 = iStack_27c;
          iStack_27c = sStack_278.v;
        }
        iVar5 = iVar36 + 1;
        if (iVar21 <= iVar36 + 1) {
          iVar5 = iVar21;
        }
        uVar17 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar15 >> 1 & 0x7f] * (char)uVar28) <<
                 (-(char)iVar5 & 0x1fU)) >> (-(char)iVar5 & 0x1fU);
        uVar28 = uVar17 * uVar15 + uVar28;
        sStack_278.q = uVar17 * iVar39 + sStack_278.q;
        uVar35 = -1 << ((byte)iVar21 & 0x1f) | uVar28;
        iVar5 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        bVar20 = (byte)iVar5;
        uVar35 = uVar28 >> (bVar20 & 0x1f);
        sStack_278.u = iVar39 << (bVar20 & 0x1f);
        sStack_278.v = iVar33 << (bVar20 & 0x1f);
        iStack_27c = uVar17 * iVar33 + iStack_27c;
        iVar36 = iVar36 - iVar5;
        iVar21 = iVar21 - iVar5;
      } while (iVar21 != 0);
    }
    uVar15 = (uint)uVar31;
    sStack_278.r = iStack_27c;
    uStack_268 = uVar31;
    secp256k1_modinv32_update_fg_30_var(uVar15,&sStack_260,&sStack_230,&sStack_278);
    if (sStack_260.v[0] == 1) {
      if ((int)uVar15 < 2) {
        return;
      }
      uVar35 = 0;
      uVar26 = 1;
      do {
        uVar35 = uVar35 | sStack_260.v[uVar26];
        uVar26 = uVar26 + 1;
      } while (uVar31 != uVar26);
      if (uVar35 == 0) {
        return;
      }
    }
    uVar35 = uVar15 - 1;
    if (((int)(uVar15 - 2) < 0 || *(int *)((long)&uStack_268 + (long)(int)uVar15 * 4 + 4) != 0) ||
        (&iStack_234)[(int)uVar15] != 0) {
      uVar35 = uVar15;
    }
    iVar16 = iVar16 + 1;
    uVar31 = (ulong)uVar35;
    uVar15 = sStack_260.v[0];
    if (iVar16 == 0x32) {
      return;
    }
  } while( true );
LAB_00160305:
  pcStack_f0 = (code *)0x16030a;
  test_modinv32_uint16_cold_5();
LAB_0016030a:
  pcStack_f0 = (code *)0x16030f;
  test_modinv32_uint16_cold_3();
LAB_0016030f:
  pcStack_f0 = (code *)0x160314;
  test_modinv32_uint16_cold_1();
  psVar27 = out_00;
LAB_00160314:
  a = psVar27;
  pcStack_f0 = (code *)0x160319;
  test_modinv32_uint16_cold_6();
  goto LAB_00160319;
LAB_00160860:
  pcStack_1d8 = (code *)0x160865;
  test_modinv64_uint16_cold_5();
  goto LAB_00160865;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}